

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::PrimitiveTypeHelper<4>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = *ptr;
  if ((output->impl_).end_ <= output->cur_) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar4;
  }
  pbVar2 = output->cur_;
  if (uVar5 < 0x80) {
    *pbVar2 = (byte)uVar5;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar5 | 0x80;
    if (uVar5 < 0x4000) {
      pbVar2[1] = (byte)(uVar5 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar5 = uVar5 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar1);
      *pbVar3 = (byte)uVar6;
    }
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteUInt64NoTag(Get<uint64>(ptr), output);
  }